

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.hh
# Opt level: O0

void __thiscall QPDFArgParser::HelpTopic::~HelpTopic(HelpTopic *this)

{
  HelpTopic *this_local;
  
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->options);
  std::__cxx11::string::~string((string *)&this->long_text);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

HelpTopic() = default;